

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileFeaturesCommand.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_b49a1d::TargetCompileFeaturesImpl::HandleMissingTarget
          (TargetCompileFeaturesImpl *this,string *name)

{
  cmMakefile *this_00;
  string local_30;
  
  this_00 = (this->super_cmTargetPropCommandBase).Makefile;
  cmStrCat<char_const(&)[45],std::__cxx11::string_const&,char_const(&)[38]>
            (&local_30,(char (*) [45])"Cannot specify compile features for target \"",name,
             (char (*) [38])"\" which is not built by this project.");
  cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void HandleMissingTarget(const std::string& name) override
  {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Cannot specify compile features for target \"", name,
               "\" which is not built by this project."));
  }